

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BVH.cpp
# Opt level: O0

void __thiscall
SimpleBVH::BVH::box_search_recursive
          (BVH *this,VectorMax3d *bbd0,VectorMax3d *bbd1,
          vector<unsigned_int,_std::allocator<unsigned_int>_> *list,int n,int b,int e)

{
  bool bVar1;
  int e_00;
  int iVar2;
  size_type sVar3;
  int childr;
  int childl;
  int m;
  int iStack_2c;
  bool cut;
  int b_local;
  int n_local;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *list_local;
  VectorMax3d *bbd1_local;
  VectorMax3d *bbd0_local;
  BVH *this_local;
  
  m = b;
  iStack_2c = n;
  _b_local = (vector<unsigned_int,std::allocator<unsigned_int>> *)list;
  list_local = (vector<unsigned_int,_std::allocator<unsigned_int>_> *)bbd1;
  bbd1_local = bbd0;
  bbd0_local = (VectorMax3d *)this;
  if (e == b) {
    __assert_fail("e != b",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                  ,0xdc,
                  "void SimpleBVH::BVH::box_search_recursive(const VectorMax3d &, const VectorMax3d &, std::vector<unsigned int> &, int, int, int) const"
                 );
  }
  sVar3 = std::
          vector<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>,_std::allocator<std::array<Eigen::Matrix<double,_-1,_1,_0,_3,_1>,_2UL>_>_>
          ::size(&this->boxlist);
  if (sVar3 <= (ulong)(long)n) {
    __assert_fail("n < boxlist.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/geometryprocessing[P]SimpleBVH/src/SimpleBVH/BVH.cpp"
                  ,0xde,
                  "void SimpleBVH::BVH::box_search_recursive(const VectorMax3d &, const VectorMax3d &, std::vector<unsigned int> &, int, int, int) const"
                 );
  }
  bVar1 = box_intersects_box(this,bbd1_local,(VectorMax3d *)list_local,iStack_2c);
  if (bVar1) {
    if (e == m + 1) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<int&>(_b_local,&m);
    }
    else {
      e_00 = m + (e - m) / 2;
      iVar2 = iStack_2c * 2;
      box_search_recursive
                (this,bbd1_local,(VectorMax3d *)list_local,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)_b_local,iStack_2c << 1,m,
                 e_00);
      box_search_recursive
                (this,bbd1_local,(VectorMax3d *)list_local,
                 (vector<unsigned_int,_std::allocator<unsigned_int>_> *)_b_local,iVar2 + 1,e_00,e);
    }
  }
  return;
}

Assistant:

void BVH::box_search_recursive(
    const VectorMax3d& bbd0,
    const VectorMax3d& bbd1,
    std::vector<unsigned int>& list,
    int n,
    int b,
    int e) const
{
    assert(e != b);

    assert(n < boxlist.size());
    bool cut = box_intersects_box(bbd0, bbd1, n);

    if (cut == false)
        return;

    // Leaf case
    if (e == b + 1) {
        list.emplace_back(b);
        return;
    }

    int m = b + (e - b) / 2;
    int childl = 2 * n;
    int childr = 2 * n + 1;

    // assert(childl < boxlist.size());
    // assert(childr < boxlist.size());

    // Traverse the "nearest" child first, so that it has more chances
    // to prune the traversal of the other child.
    box_search_recursive(bbd0, bbd1, list, childl, b, m);
    box_search_recursive(bbd0, bbd1, list, childr, m, e);
}